

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O1

void __thiscall duckdb::Blob::ToBase64(Blob *this,string_t blob,char *output)

{
  ulong uVar1;
  ulong uVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  string_t blob_local;
  
  lVar4 = blob.value._8_8_;
  blob_local.value.pointer.ptr = blob.value._0_8_;
  uVar7 = (ulong)this & 0xffffffff;
  pcVar5 = blob.value._0_8_;
  if (uVar7 < 0xd) {
    pcVar5 = blob_local.value.pointer.prefix;
  }
  if (uVar7 < 3) {
    uVar2 = 0;
    uVar6 = 0;
  }
  else {
    uVar2 = 0;
    uVar1 = 2;
    do {
      uVar6 = uVar1;
      *(char *)(lVar4 + uVar2) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)pcVar5[uVar6 - 2] >> 2];
      *(char *)(lVar4 + 1 + uVar2) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)((byte)pcVar5[uVar6 - 1] >> 4) | ((byte)pcVar5[uVar6 - 2] & 3) << 4];
      *(char *)(lVar4 + 2 + uVar2) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(uint)((byte)pcVar5[uVar6] >> 6) + ((byte)pcVar5[uVar6 - 1] & 0xf) * 4];
      *(char *)(lVar4 + 3 + uVar2) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)pcVar5[uVar6] & 0x3f];
      uVar2 = uVar2 + 4;
      uVar1 = uVar6 + 3;
    } while (uVar6 + 3 < uVar7);
    uVar6 = uVar6 + 1;
  }
  if (uVar6 < uVar7) {
    *(char *)(lVar4 + uVar2) =
         "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(byte)pcVar5[uVar6] >> 2];
    uVar8 = ((byte)pcVar5[uVar6] & 3) << 4;
    if (uVar6 == uVar7 - 1) {
      *(char *)(lVar4 + (uVar2 | 1)) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[uVar8];
      cVar3 = '=';
    }
    else {
      *(char *)(lVar4 + (uVar2 | 1)) =
           "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(byte)((byte)uVar8 | (byte)pcVar5[uVar6 + 1] >> 4)];
      cVar3 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(ulong)((byte)pcVar5[uVar6 + 1] & 0xf) * 4];
    }
    *(char *)(lVar4 + 2 + uVar2) = cVar3;
    *(undefined1 *)(lVar4 + 3 + uVar2) = 0x3d;
  }
  return;
}

Assistant:

const char *GetData() const {
		return IsInlined() ? const_char_ptr_cast(value.inlined.inlined) : value.pointer.ptr;
	}